

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

bool __thiscall cmCTestBZR::UpdateParser::ProcessLine(UpdateParser *this)

{
  RegularExpression *this_00;
  char c0;
  char c1;
  char c2;
  bool bVar1;
  string sStack_a8;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = &this->RegexUpdate;
  bVar1 = cmsys::RegularExpression::find(this_00,&(this->super_LineParser).Line);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&local_48,this_00,1);
    c0 = *local_48._M_dataplus._M_p;
    cmsys::RegularExpression::match_abi_cxx11_(&local_68,this_00,2);
    c1 = *local_68._M_dataplus._M_p;
    cmsys::RegularExpression::match_abi_cxx11_(&local_88,this_00,3);
    c2 = *local_88._M_dataplus._M_p;
    cmsys::RegularExpression::match_abi_cxx11_(&sStack_a8,this_00,4);
    DoPath(this,c0,c1,c2,&sStack_a8);
    std::__cxx11::string::~string((string *)&sStack_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return true;
}

Assistant:

bool ProcessLine()
    {
    if(this->RegexUpdate.find(this->Line))
      {
      this->DoPath(this->RegexUpdate.match(1)[0],
                   this->RegexUpdate.match(2)[0],
                   this->RegexUpdate.match(3)[0],
                   this->RegexUpdate.match(4));
      }
    return true;
    }